

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraSublimeTextGenerator::CreateProjectFile
          (cmExtraSublimeTextGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs)

{
  char *pcVar1;
  string projectName;
  string filename;
  string outputDir;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pcVar1 = cmLocalGenerator::GetCurrentBinaryDirectory
                     (*(lgs->
                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                       _M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::string((string *)&local_30,pcVar1,(allocator *)&local_b0);
  cmLocalGenerator::GetProjectName_abi_cxx11_
            (&local_b0,
             *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start);
  std::operator+(&local_90,&local_30,"/");
  std::operator+(&local_70,&local_90,&local_b0);
  std::operator+(&local_50,&local_70,".sublime-project");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  CreateNewProjectFile(this,lgs,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::CreateProjectFile(
                                     const std::vector<cmLocalGenerator*>& lgs)
{
  std::string outputDir=lgs[0]->GetCurrentBinaryDirectory();
  std::string projectName=lgs[0]->GetProjectName();

  const std::string filename =
                     outputDir + "/" + projectName + ".sublime-project";

  this->CreateNewProjectFile(lgs, filename);
}